

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

void la_adsc_contract_request_format_text(la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  byte *pbVar1;
  size_t sVar2;
  la_list *l;
  byte *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  la_adsc_tag_t *t;
  la_list *ptr;
  size_t len;
  la_adsc_req_t *r;
  la_list *in_stack_ffffffffffffffd0;
  
  la_vstring_append_sprintf((la_vstring *)*in_RDI,"%*s%s:\n",(ulong)*(uint *)(in_RDI + 1),"",in_RSI)
  ;
  *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
  la_vstring_append_sprintf
            ((la_vstring *)*in_RDI,"%*sContract number: %u\n",(ulong)*(uint *)(in_RDI + 1),"",
             (ulong)*in_RDX);
  sVar2 = la_list_length(in_stack_ffffffffffffffd0);
  if (sVar2 != 0) {
    for (l = *(la_list **)(in_RDX + 8); l != (la_list *)0x0; l = la_list_next(l)) {
      pbVar1 = (byte *)l->data;
      if (*(long *)(pbVar1 + 8) == 0) {
        la_vstring_append_sprintf
                  ((la_vstring *)*in_RDI,"%*s-- Unparseable tag %u\n",(ulong)*(uint *)(in_RDI + 1),
                   "",(ulong)*pbVar1);
        break;
      }
      (**(code **)(*(long *)(pbVar1 + 8) + 0x18))
                (in_RDI,**(undefined8 **)(pbVar1 + 8),*(undefined8 *)(pbVar1 + 0x10));
    }
    *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + -1;
  }
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_contract_request_format_text) {
	la_adsc_req_t const *r = data;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "%s:\n", label);
	ctx->indent++;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "Contract number: %u\n", r->contract_num);

	size_t len = la_list_length(r->req_tag_list);
	if(len == 0) {
		return;
	}
	for(la_list *ptr = r->req_tag_list; ptr != NULL; ptr = la_list_next(ptr)) {
		la_adsc_tag_t *t = ptr->data;
		if(!t->type) {
			LA_ISPRINTF(ctx->vstr, ctx->indent, "-- Unparseable tag %u\n", t->tag);
			break;
		}
		la_assert(t->type->format_text != NULL);
		t->type->format_text(ctx, t->type->label, t->data);
	}
	ctx->indent--;
}